

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>,_4,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>
           *kernel)

{
  DstXprType *pDVar1;
  PointerType pfVar2;
  ulong uVar3;
  DstEvaluatorType *pDVar4;
  SrcEvaluatorType *pSVar5;
  PointerType pfVar6;
  Index IVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  Index row;
  ulong uVar12;
  long lVar13;
  Index inner;
  ulong uVar14;
  Index inner_1;
  Index col;
  long col_00;
  
  pDVar1 = kernel->m_dstExpr;
  pfVar2 = (pDVar1->
           super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
           m_data;
  if (((ulong)pfVar2 & 3) != 0) {
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::mul_assign_op<float,_float>,_0>,_0,_0>
    ::run(kernel);
    return;
  }
  uVar3 = (pDVar1->
          super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_rows.m_value;
  lVar8 = (pDVar1->
          super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_cols.m_value;
  lVar11 = 0;
  IVar7 = (((pDVar1->
            super_BlockImpl<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
            super_BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
           m_xpr)->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows
  ;
  uVar10 = (ulong)(-((uint)((ulong)pfVar2 >> 2) & 0x3fffffff) & 3);
  if ((long)uVar3 <= (long)uVar10) {
    uVar10 = uVar3;
  }
  if (lVar8 < 1) {
    lVar8 = lVar11;
  }
  for (col_00 = 0; col_00 != lVar8; col_00 = col_00 + 1) {
    pDVar4 = kernel->m_dst;
    pSVar5 = kernel->m_src;
    uVar14 = 0;
    if (0 < (long)uVar10) {
      uVar14 = uVar10;
    }
    for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      lVar13 = (pDVar4->
               super_block_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>).
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
               .m_outerStride.m_value * lVar11;
      pfVar6 = (pDVar4->
               super_block_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>).
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
               .m_data;
      *(float *)((long)pfVar6 + uVar12 * 4 + lVar13) =
           (pSVar5->m_functor).m_other * *(float *)((long)pfVar6 + uVar12 * 4 + lVar13);
    }
    lVar13 = (uVar3 - uVar10 & 0xfffffffffffffffc) + uVar10;
    for (uVar14 = uVar10; (long)uVar14 < lVar13; uVar14 = uVar14 + 4) {
      generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,-1,false>>,Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,-1,0,-1,-1>>>,Eigen::internal::mul_assign_op<float,float>,0>
      ::assignPacket<16,0,float__vector(4)>
                ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,_1,false>>,Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>>,Eigen::internal::mul_assign_op<float,float>,0>
                  *)kernel,uVar14,col_00);
    }
    pDVar4 = kernel->m_dst;
    pSVar5 = kernel->m_src;
    for (; lVar13 < (long)uVar3; lVar13 = lVar13 + 1) {
      lVar9 = (pDVar4->
              super_block_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>).
              super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
              .m_outerStride.m_value * lVar11;
      pfVar6 = (pDVar4->
               super_block_evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true>).
               super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
               .m_data;
      *(float *)((long)pfVar6 + lVar13 * 4 + lVar9) =
           (pSVar5->m_functor).m_other * *(float *)((long)pfVar6 + lVar13 * 4 + lVar9);
    }
    uVar10 = (long)(uVar10 + (-(int)IVar7 & 3)) % 4;
    if ((long)uVar3 < (long)uVar10) {
      uVar10 = uVar3;
    }
    lVar11 = lVar11 + 4;
  }
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      packetSize = unpacket_traits<PacketType>::size,
      requestedAlignment = int(Kernel::AssignmentTraits::InnerRequiredAlignment),
      alignable = packet_traits<Scalar>::AlignedOnScalar || int(Kernel::AssignmentTraits::DstAlignment)>=sizeof(Scalar),
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = alignable ? int(requestedAlignment)
                               : int(Kernel::AssignmentTraits::DstAlignment)
    };
    const Scalar *dst_ptr = kernel.dstDataPtr();
    if((!bool(dstIsAligned)) && (UIntPtr(dst_ptr) % sizeof(Scalar))>0)
    {
      // the pointer is not aligned-on scalar, so alignment is not possible
      return dense_assignment_loop<Kernel,DefaultTraversal,NoUnrolling>::run(kernel);
    }
    const Index packetAlignedMask = packetSize - 1;
    const Index innerSize = kernel.innerSize();
    const Index outerSize = kernel.outerSize();
    const Index alignedStep = alignable ? (packetSize - kernel.outerStride() % packetSize) & packetAlignedMask : 0;
    Index alignedStart = ((!alignable) || bool(dstIsAligned)) ? 0 : internal::first_aligned<requestedAlignment>(dst_ptr, innerSize);

    for(Index outer = 0; outer < outerSize; ++outer)
    {
      const Index alignedEnd = alignedStart + ((innerSize-alignedStart) & ~packetAlignedMask);
      // do the non-vectorizable part of the assignment
      for(Index inner = 0; inner<alignedStart ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      // do the vectorizable part of the assignment
      for(Index inner = alignedStart; inner<alignedEnd; inner+=packetSize)
        kernel.template assignPacketByOuterInner<dstAlignment, Unaligned, PacketType>(outer, inner);

      // do the non-vectorizable part of the assignment
      for(Index inner = alignedEnd; inner<innerSize ; ++inner)
        kernel.assignCoeffByOuterInner(outer, inner);

      alignedStart = numext::mini((alignedStart+alignedStep)%packetSize, innerSize);
    }
  }